

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O0

void QGraphicsEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  void *_v_1;
  void *_v;
  QGraphicsEffect *_t;
  QGraphicsEffect *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 uVar2;
  undefined1 enable;
  code *in_stack_ffffffffffffffd0;
  
  enable = (undefined1)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      enabledChanged((QGraphicsEffect *)0x4a59f9,false);
    }
    else if (in_EDX == 1) {
      setEnabled((QGraphicsEffect *)in_stack_ffffffffffffffd0,(bool)enable);
    }
    else if (in_EDX == 2) {
      update(in_stack_ffffffffffffffc0);
    }
  }
  if (in_ESI == 5) {
    in_stack_ffffffffffffffd0 = enabledChanged;
    bVar1 = QtMocHelpers::indexOfMethod<void(QGraphicsEffect::*)(bool)>
                      (in_RCX,(void **)enabledChanged,0,0);
    if (bVar1) {
      return;
    }
  }
  if (in_ESI == 1) {
    uVar2 = *(undefined8 *)in_RCX;
    if (in_EDX == 0) {
      bVar1 = isEnabled(in_stack_ffffffffffffffc0);
      *(bool *)uVar2 = bVar1;
    }
    enable = (undefined1)((ulong)uVar2 >> 0x38);
  }
  if ((in_ESI == 2) && (in_EDX == 0)) {
    setEnabled((QGraphicsEffect *)in_stack_ffffffffffffffd0,(bool)enable);
  }
  return;
}

Assistant:

void QGraphicsEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->enabledChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->setEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->update(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsEffect::*)(bool )>(_a, &QGraphicsEffect::enabledChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}